

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstrumentMemory.cpp
# Opt level: O1

void __thiscall wasm::InstrumentMemory::visitStructGet(InstrumentMemory *this,StructGet *curr)

{
  Index x;
  uintptr_t uVar1;
  undefined8 uVar2;
  uintptr_t uVar3;
  Expression *expression;
  MixedArena *this_00;
  initializer_list<wasm::Expression_*> __l;
  Const *local_78;
  StructGet *local_70;
  Builder local_68;
  Builder builder;
  pointer local_50;
  allocator_type local_31;
  
  local_68.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>_>
       ).super_PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>.
       super_Walker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>.currModule
  ;
  uVar1 = (curr->super_SpecificExpression<(wasm::Expression::Id)61>).super_Expression.type.id;
  if (uVar1 - 2 < 4) {
    uVar2 = *(undefined8 *)(&PTR_DAT_00d89030)[uVar1];
    uVar1 = *(uintptr_t *)(&PTR_DAT_00d89010)[uVar1];
    x = this->id;
    this->id = x + 1;
    local_78 = Builder::makeConst<int>(&local_68,x);
    __l._M_len = 2;
    __l._M_array = (iterator)&local_78;
    local_70 = curr;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder,__l,
               &local_31);
    uVar3 = (curr->super_SpecificExpression<(wasm::Expression::Id)61>).super_Expression.type.id;
    this_00 = &(local_68.wasm)->allocator;
    expression = (Expression *)MixedArena::allocSpace(this_00,0x48,8);
    expression->_id = CallId;
    (expression->type).id = 0;
    *(undefined8 *)(expression + 1) = 0;
    expression[1].type.id = 0;
    *(undefined8 *)(expression + 2) = 0;
    expression[2].type.id = (uintptr_t)this_00;
    *(undefined8 *)(expression + 3) = 0;
    expression[3].type.id = 0;
    *(undefined1 *)&expression[4]._id = InvalidId;
    (expression->type).id = uVar3;
    *(undefined8 *)(expression + 3) = uVar2;
    expression[3].type.id = uVar1;
    ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
    set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
              ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)(expression + 1)
               ,(vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder);
    *(undefined1 *)&expression[4]._id = InvalidId;
    Walker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>::replaceCurrent
              (&(this->
                super_WalkerPass<wasm::PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>_>
                ).
                super_PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>
                .super_Walker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>,
               expression);
    if (builder.wasm != (Module *)0x0) {
      operator_delete(builder.wasm,(long)local_50 - (long)builder.wasm);
    }
  }
  return;
}

Assistant:

void visitStructGet(StructGet* curr) {
    Builder builder(*getModule());
    Name target;
    if (curr->type == Type::i32) {
      target = struct_get_val_i32;
    } else if (curr->type == Type::i64) {
      target = struct_get_val_i64;
    } else if (curr->type == Type::f32) {
      target = struct_get_val_f32;
    } else if (curr->type == Type::f64) {
      target = struct_get_val_f64;
    } else {
      return; // TODO: other types, unreachable, etc.
    }
    replaceCurrent(builder.makeCall(
      target, {builder.makeConst(int32_t(id++)), curr}, curr->type));
  }